

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3EvalTestExpr(Fts3Cursor *pCsr,Fts3Expr *pExpr,int *pRc)

{
  Fts3DeferredToken *pFVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  Fts3Expr *pFVar5;
  char *pcVar6;
  Fts3Expr *pFVar7;
  Fts3Phrase *pFVar8;
  Fts3Expr *pFVar9;
  long lVar10;
  int iVar11;
  Fts3DeferredToken **ppFVar12;
  ulong __n;
  Fts3Expr *p;
  bool bVar13;
  char *aPoslist;
  char *p1;
  char *p2;
  int local_78;
  int local_74;
  char *local_70;
  char *local_68;
  Fts3Phrase *local_60;
  char *local_58;
  Fts3Cursor *local_50;
  ulong local_48;
  char *local_40;
  int *local_38;
  
  if (*pRc != 0) {
    return 1;
  }
  switch(pExpr->eType) {
  case 1:
  case 3:
    iVar4 = fts3EvalTestExpr(pCsr,pExpr->pLeft,pRc);
    iVar2 = 0;
    if (((((iVar4 != 0) && (iVar4 = fts3EvalTestExpr(pCsr,pExpr->pRight,pRc), iVar4 != 0)) &&
         (iVar2 = 1, *pRc == 0)) && ((pExpr->eType == 1 && (pExpr->bEof == '\0')))) &&
       ((pExpr->pParent == (Fts3Expr *)0x0 || (pExpr->pParent->eType != 1)))) {
      iVar2 = 0;
      iVar4 = 0;
      pFVar9 = pExpr;
      if (pExpr->pLeft != (Fts3Expr *)0x0) {
        iVar4 = 0;
        pFVar5 = pExpr->pLeft;
        pFVar7 = pExpr;
        do {
          pFVar9 = pFVar5;
          iVar4 = iVar4 + (pFVar7->pRight->pPhrase->doclist).nList;
          pFVar5 = pFVar9->pLeft;
          pFVar7 = pFVar9;
        } while (pFVar9->pLeft != (Fts3Expr *)0x0);
      }
      iVar4 = iVar4 + (pFVar9->pPhrase->doclist).nList;
      if (iVar4 != 0) {
        local_50 = pCsr;
        pcVar6 = (char *)sqlite3_malloc(iVar4 * 2);
        if (pcVar6 == (char *)0x0) {
          *pRc = 7;
          iVar2 = 0;
        }
        else {
          local_68 = (pFVar9->pPhrase->doclist).pList;
          pFVar5 = pFVar9->pParent;
          iVar2 = 1;
          if ((pFVar5 != (Fts3Expr *)0x0) && (pFVar5->eType == 1)) {
            local_58._0_4_ = pFVar9->pPhrase->nToken;
            do {
              iVar2 = fts3EvalNearTrim(pFVar5->nNear,pcVar6,&local_68,(int *)&local_58,
                                       pFVar5->pRight->pPhrase);
              if ((iVar2 == 0) || (pFVar5 = pFVar5->pParent, pFVar5 == (Fts3Expr *)0x0)) break;
            } while (pFVar5->eType == 1);
          }
          pFVar8 = pExpr->pRight->pPhrase;
          local_68 = (pFVar8->doclist).pList;
          local_58 = (char *)CONCAT44(local_58._4_4_,pFVar8->nToken);
          pFVar9 = pExpr->pLeft;
          if (iVar2 != 0 && pFVar9 != (Fts3Expr *)0x0) {
            do {
              pFVar5 = pFVar9;
              if (pFVar9->eType == 1) {
                pFVar5 = pFVar9->pRight;
              }
              iVar2 = fts3EvalNearTrim(pFVar9->pParent->nNear,pcVar6,&local_68,(int *)&local_58,
                                       pFVar5->pPhrase);
              pFVar9 = pFVar9->pLeft;
            } while ((pFVar9 != (Fts3Expr *)0x0) && (iVar2 != 0));
          }
        }
        sqlite3_free(pcVar6);
        pCsr = local_50;
      }
    }
    if (iVar2 != 0) {
      return iVar2;
    }
    if (pExpr->eType != 1) {
      return 0;
    }
    if ((pExpr->pParent != (Fts3Expr *)0x0) && (pExpr->pParent->eType == 1)) {
      return 0;
    }
    pFVar8 = pExpr->pPhrase;
    while (pFVar8 == (Fts3Phrase *)0x0) {
      if (pExpr->pRight->iDocid == pCsr->iPrevId) {
        pFVar8 = pExpr->pRight->pPhrase;
        if ((pFVar8->doclist).bFreeList != 0) {
          sqlite3_free((pFVar8->doclist).pList);
        }
        (pFVar8->doclist).pList = (char *)0x0;
        (pFVar8->doclist).nList = 0;
        (pFVar8->doclist).bFreeList = 0;
      }
      pExpr = pExpr->pLeft;
      pFVar8 = pExpr->pPhrase;
    }
    if (pExpr->iDocid == pCsr->iPrevId) {
      if ((pFVar8->doclist).bFreeList != 0) {
        sqlite3_free((pFVar8->doclist).pList);
      }
      (pFVar8->doclist).pList = (char *)0x0;
      (pFVar8->doclist).nList = 0;
      (pFVar8->doclist).bFreeList = 0;
      return 0;
    }
    return 0;
  case 2:
    iVar4 = fts3EvalTestExpr(pCsr,pExpr->pLeft,pRc);
    if (iVar4 == 0) {
      return 0;
    }
    iVar4 = fts3EvalTestExpr(pCsr,pExpr->pRight,pRc);
    bVar13 = iVar4 == 0;
LAB_001831f3:
    return (uint)bVar13;
  case 4:
    iVar4 = fts3EvalTestExpr(pCsr,pExpr->pLeft,pRc);
    iVar2 = fts3EvalTestExpr(pCsr,pExpr->pRight,pRc);
    return (uint)(iVar2 != 0 || iVar4 != 0);
  }
  if ((pCsr->pDeferred == (Fts3DeferredToken *)0x0) ||
     ((pExpr->iDocid != pCsr->iPrevId && (pExpr->bDeferred == '\0')))) {
    if (pExpr->bEof != '\0') {
      return 0;
    }
    bVar13 = pExpr->iDocid == pCsr->iPrevId;
    goto LAB_001831f3;
  }
  local_60 = pExpr->pPhrase;
  if (pExpr->bDeferred != '\0') {
    if ((local_60->doclist).bFreeList != 0) {
      sqlite3_free((local_60->doclist).pList);
    }
    (local_60->doclist).pList = (char *)0x0;
    (local_60->doclist).nList = 0;
    (local_60->doclist).bFreeList = 0;
  }
  pFVar8 = local_60;
  local_38 = pRc;
  if (local_60->nToken < 1) {
    local_48 = 0;
    local_78 = -1;
    local_70 = (char *)0x0;
  }
  else {
    ppFVar12 = &local_60->aToken[0].pDeferred;
    local_78 = -1;
    lVar10 = 0;
    local_70 = (char *)0x0;
    local_48 = 0;
    local_50 = pCsr;
    do {
      pFVar1 = *ppFVar12;
      iVar4 = local_78;
      if (pFVar1 == (Fts3DeferredToken *)0x0) {
        bVar13 = true;
      }
      else {
        bVar13 = true;
        if (pFVar1->pList == (PendingList *)0x0) {
          pcVar6 = (char *)0x0;
          __n = 0;
          iVar2 = 0;
        }
        else {
          pcVar6 = (char *)sqlite3_malloc(pFVar1->pList->nData);
          bVar13 = pcVar6 == (char *)0x0;
          if (bVar13) {
            iVar2 = 7;
            pcVar6 = (char *)0x0;
            __n = 0;
          }
          else {
            iVar2 = sqlite3Fts3GetVarint(pFVar1->pList->aData,(sqlite_int64 *)&local_68);
            __n = (long)pFVar1->pList->nData - (long)iVar2;
            memcpy(pcVar6,pFVar1->pList->aData + iVar2,__n);
            iVar2 = 0;
          }
          bVar13 = !bVar13;
          pFVar8 = local_60;
        }
        pCsr = local_50;
        if (bVar13) {
          if (pcVar6 == (char *)0x0) {
            sqlite3_free(local_70);
            (local_60->doclist).pList = (char *)0x0;
            (local_60->doclist).nList = 0;
            bVar13 = false;
            local_74 = 0;
            pFVar8 = local_60;
            pCsr = local_50;
          }
          else {
            iVar4 = (int)lVar10;
            if (local_70 == (char *)0x0) {
              bVar13 = true;
              local_70 = pcVar6;
              local_48 = __n;
            }
            else {
              local_58 = local_70;
              local_68 = pcVar6;
              local_40 = pcVar6;
              fts3PoslistPhraseMerge(&local_68,iVar4 - local_78,0,1,&local_58,&local_40);
              sqlite3_free(local_70);
              uVar3 = (int)local_68 - (int)pcVar6;
              local_48 = (ulong)uVar3;
              bVar13 = uVar3 != 0;
              pFVar8 = local_60;
              pCsr = local_50;
              local_70 = pcVar6;
              if (uVar3 == 0) {
                sqlite3_free(pcVar6);
                (local_60->doclist).pList = (char *)0x0;
                (local_60->doclist).nList = 0;
                local_74 = 0;
                pFVar8 = local_60;
                pCsr = local_50;
                iVar4 = local_78;
              }
            }
          }
        }
        else {
          bVar13 = false;
          local_74 = iVar2;
        }
      }
      local_78 = iVar4;
      if (!bVar13) goto LAB_001832da;
      lVar10 = lVar10 + 1;
      ppFVar12 = ppFVar12 + 5;
    } while (lVar10 < pFVar8->nToken);
  }
  if (-1 < local_78) {
    iVar4 = pFVar8->iDoclistToken;
    if (iVar4 < 0) {
      (pFVar8->doclist).pList = local_70;
      (pFVar8->doclist).nList = (int)local_48;
      (pFVar8->doclist).iDocid = pCsr->iPrevId;
      (pFVar8->doclist).bFreeList = 1;
      bVar13 = true;
    }
    else {
      iVar2 = iVar4 - local_78;
      if (iVar2 == 0 || iVar4 < local_78) {
        local_68 = (pFVar8->doclist).pList;
        local_58 = local_70;
        iVar2 = local_78 - iVar4;
      }
      else {
        local_68 = local_70;
        local_58 = (pFVar8->doclist).pList;
      }
      local_40 = (char *)sqlite3_malloc((int)local_48 + 8);
      pFVar8 = local_60;
      bVar13 = local_40 != (char *)0x0;
      if (local_40 == (char *)0x0) {
        local_74 = 7;
      }
      else {
        (local_60->doclist).pList = local_40;
        iVar11 = 0;
        iVar4 = fts3PoslistPhraseMerge(&local_40,iVar2,0,1,&local_68,&local_58);
        if (iVar4 == 0) {
          sqlite3_free(local_40);
          (pFVar8->doclist).pList = (char *)0x0;
        }
        else {
          (pFVar8->doclist).bFreeList = 1;
          iVar11 = (int)local_40 - *(int *)&(pFVar8->doclist).pList;
        }
        (pFVar8->doclist).nList = iVar11;
      }
      sqlite3_free(local_70);
      pFVar8 = local_60;
    }
    if (!bVar13) goto LAB_001832da;
  }
  local_74 = 0;
LAB_001832da:
  *local_38 = local_74;
  pcVar6 = (pFVar8->doclist).pList;
  pExpr->iDocid = pCsr->iPrevId;
  return (uint)(pcVar6 != (char *)0x0);
}

Assistant:

static int fts3EvalTestExpr(
  Fts3Cursor *pCsr,               /* FTS cursor handle */
  Fts3Expr *pExpr,                /* Expr to test. May or may not be root. */
  int *pRc                        /* IN/OUT: Error code */
){
  int bHit = 1;                   /* Return value */
  if( *pRc==SQLITE_OK ){
    switch( pExpr->eType ){
      case FTSQUERY_NEAR:
      case FTSQUERY_AND:
        bHit = (
            fts3EvalTestExpr(pCsr, pExpr->pLeft, pRc)
         && fts3EvalTestExpr(pCsr, pExpr->pRight, pRc)
         && fts3EvalNearTest(pExpr, pRc)
        );

        /* If the NEAR expression does not match any rows, zero the doclist for 
        ** all phrases involved in the NEAR. This is because the snippet(),
        ** offsets() and matchinfo() functions are not supposed to recognize 
        ** any instances of phrases that are part of unmatched NEAR queries. 
        ** For example if this expression:
        **
        **    ... MATCH 'a OR (b NEAR c)'
        **
        ** is matched against a row containing:
        **
        **        'a b d e'
        **
        ** then any snippet() should ony highlight the "a" term, not the "b"
        ** (as "b" is part of a non-matching NEAR clause).
        */
        if( bHit==0 
         && pExpr->eType==FTSQUERY_NEAR 
         && (pExpr->pParent==0 || pExpr->pParent->eType!=FTSQUERY_NEAR)
        ){
          Fts3Expr *p;
          for(p=pExpr; p->pPhrase==0; p=p->pLeft){
            if( p->pRight->iDocid==pCsr->iPrevId ){
              fts3EvalInvalidatePoslist(p->pRight->pPhrase);
            }
          }
          if( p->iDocid==pCsr->iPrevId ){
            fts3EvalInvalidatePoslist(p->pPhrase);
          }
        }

        break;

      case FTSQUERY_OR: {
        int bHit1 = fts3EvalTestExpr(pCsr, pExpr->pLeft, pRc);
        int bHit2 = fts3EvalTestExpr(pCsr, pExpr->pRight, pRc);
        bHit = bHit1 || bHit2;
        break;
      }

      case FTSQUERY_NOT:
        bHit = (
            fts3EvalTestExpr(pCsr, pExpr->pLeft, pRc)
         && !fts3EvalTestExpr(pCsr, pExpr->pRight, pRc)
        );
        break;

      default: {
#ifndef SQLITE_DISABLE_FTS4_DEFERRED
        if( pCsr->pDeferred 
         && (pExpr->iDocid==pCsr->iPrevId || pExpr->bDeferred)
        ){
          Fts3Phrase *pPhrase = pExpr->pPhrase;
          assert( pExpr->bDeferred || pPhrase->doclist.bFreeList==0 );
          if( pExpr->bDeferred ){
            fts3EvalInvalidatePoslist(pPhrase);
          }
          *pRc = fts3EvalDeferredPhrase(pCsr, pPhrase);
          bHit = (pPhrase->doclist.pList!=0);
          pExpr->iDocid = pCsr->iPrevId;
        }else
#endif
        {
          bHit = (pExpr->bEof==0 && pExpr->iDocid==pCsr->iPrevId);
        }
        break;
      }
    }
  }
  return bHit;
}